

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterNext_Reverse(Fts5Index *p,Fts5SegIter *pIter,int *pbUnused)

{
  u8 *puVar1;
  int iVar2;
  i64 iDelta;
  u64 local_20;
  
  iVar2 = pIter->iRowidOffset;
  if (0 < (long)iVar2) {
    puVar1 = pIter->pLeaf->p;
    pIter->iRowidOffset = iVar2 + -1;
    pIter->iLeafOffset = pIter->aRowidOffset[(long)iVar2 + -1];
    fts5SegIterLoadNPos(p,pIter);
    iVar2 = pIter->iLeafOffset;
    if (p->pConfig->eDetail != 1) {
      iVar2 = iVar2 + pIter->nPos;
    }
    sqlite3Fts5GetVarint(puVar1 + iVar2,&local_20);
    pIter->iRowid = pIter->iRowid - local_20;
    return;
  }
  fts5SegIterReverseNewPage(p,pIter);
  return;
}

Assistant:

static void fts5SegIterNext_Reverse(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbUnused                   /* Unused */
){
  assert( pIter->flags & FTS5_SEGITER_REVERSE );
  assert( pIter->pNextLeaf==0 );
  UNUSED_PARAM(pbUnused);

  if( pIter->iRowidOffset>0 ){
    u8 *a = pIter->pLeaf->p;
    int iOff;
    i64 iDelta;

    pIter->iRowidOffset--;
    pIter->iLeafOffset = pIter->aRowidOffset[pIter->iRowidOffset];
    fts5SegIterLoadNPos(p, pIter);
    iOff = pIter->iLeafOffset;
    if( p->pConfig->eDetail!=FTS5_DETAIL_NONE ){
      iOff += pIter->nPos;
    }
    fts5GetVarint(&a[iOff], (u64*)&iDelta);
    pIter->iRowid -= iDelta;
  }else{
    fts5SegIterReverseNewPage(p, pIter);
  }
}